

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
booster::locale::dpgettext<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,char *domain,wchar_t *context,wchar_t *id,locale *loc)

{
  allocator local_b1;
  string local_b0;
  basic_message<wchar_t> local_90;
  
  local_90.id_._M_dataplus._M_p = (pointer)&local_90.id_.field_2;
  local_90.n_ = 0;
  local_90.c_plural_ = (char_type_conflict *)0x0;
  local_90.id_._M_string_length = 0;
  local_90.id_.field_2._M_local_buf[0] = L'\0';
  local_90.context_._M_dataplus._M_p = (pointer)&local_90.context_.field_2;
  local_90.context_._M_string_length = 0;
  local_90.context_.field_2._M_local_buf[0] = L'\0';
  local_90.plural_._M_dataplus._M_p = (pointer)&local_90.plural_.field_2;
  local_90.plural_._M_string_length = 0;
  local_90.plural_.field_2._M_local_buf[0] = L'\0';
  local_90.c_id_ = id;
  local_90.c_context_ = context;
  std::__cxx11::string::string((string *)&local_b0,domain,&local_b1);
  basic_message<wchar_t>::str(__return_storage_ptr__,&local_90,loc,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  basic_message<wchar_t>::~basic_message(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType>  dpgettext( char const *domain,
                                                CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc,domain);
        }